

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O1

PyObject * libxml_xmlParserCtxtPtrWrap(xmlParserCtxtPtr ctxt)

{
  PyObject *pPVar1;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    pPVar1 = (PyObject *)PyCapsule_New(ctxt,"xmlParserCtxtPtr",0);
    return pPVar1;
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlParserCtxtPtrWrap(xmlParserCtxtPtr ctxt)
{
    PyObject *ret;

    if (ctxt == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }

    ret = PyCapsule_New((void *) ctxt, (char *) "xmlParserCtxtPtr", NULL);
    return (ret);
}